

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void inter_mode_data_push
               (TileDataEnc *tile_data,BLOCK_SIZE bsize,int64_t sse,int64_t dist,int residue_cost)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if ((sse - dist != 0 && residue_cost != 0) &&
     ((BLOCK_16X4 < bsize || ((0x30007U >> (bsize & 0x1f) & 1) == 0)))) {
    iVar1 = tile_data->inter_mode_rd_models[bsize].num;
    if (iVar1 < 0x1900) {
      dVar4 = (double)(sse - dist) / (double)residue_cost;
      tile_data->inter_mode_rd_models[bsize].num = iVar1 + 1;
      dVar5 = tile_data->inter_mode_rd_models[bsize].ld_sum;
      dVar2 = tile_data->inter_mode_rd_models[bsize].sse_sse_sum;
      dVar3 = tile_data->inter_mode_rd_models[bsize].sse_ld_sum;
      tile_data->inter_mode_rd_models[bsize].dist_sum =
           tile_data->inter_mode_rd_models[bsize].dist_sum + (double)dist;
      tile_data->inter_mode_rd_models[bsize].ld_sum = dVar5 + dVar4;
      dVar5 = (double)sse;
      tile_data->inter_mode_rd_models[bsize].sse_sum =
           tile_data->inter_mode_rd_models[bsize].sse_sum + dVar5;
      tile_data->inter_mode_rd_models[bsize].sse_sse_sum = dVar5 * dVar5 + dVar2;
      tile_data->inter_mode_rd_models[bsize].sse_ld_sum = dVar4 * dVar5 + dVar3;
      return;
    }
  }
  return;
}

Assistant:

static inline void inter_mode_data_push(TileDataEnc *tile_data,
                                        BLOCK_SIZE bsize, int64_t sse,
                                        int64_t dist, int residue_cost) {
  if (residue_cost == 0 || sse == dist) return;
  const int block_idx = inter_mode_data_block_idx(bsize);
  if (block_idx == -1) return;
  InterModeRdModel *rd_model = &tile_data->inter_mode_rd_models[bsize];
  if (rd_model->num < INTER_MODE_RD_DATA_OVERALL_SIZE) {
    const double ld = (sse - dist) * 1. / residue_cost;
    ++rd_model->num;
    rd_model->dist_sum += dist;
    rd_model->ld_sum += ld;
    rd_model->sse_sum += sse;
    rd_model->sse_sse_sum += (double)sse * (double)sse;
    rd_model->sse_ld_sum += sse * ld;
  }
}